

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZydisFuzzShared.c
# Opt level: O1

void ZydisReEncodeInstruction
               (ZydisDecoder *decoder,ZydisDecodedInstruction *insn1,ZydisDecodedOperand *operands1,
               ZyanU8 operand_count,ZyanU8 *insn1_bytes)

{
  bool bVar1;
  ZyanStatus ZVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ZyanI64 *result_address;
  ZydisDecodedOperand *operands;
  ZyanI64 *pZVar6;
  ulong uVar7;
  long lVar8;
  ZyanU8 encoded_instruction [15];
  ZyanUSize encoded_length;
  ZyanU8 insn1_bytes_1 [15];
  ZydisDecodedInstruction insn2;
  ZydisEncoderRequest request;
  ZydisDecodedOperand operands2 [10];
  ZyanU8 local_65f [15];
  ZyanUSize local_650;
  ZyanUSize local_648;
  undefined1 local_63f [15];
  ZydisDecodedInstruction local_630;
  ZydisEncoderRequest local_4e8;
  ZydisDecodedOperand local_358 [10];
  
  ZydisPrintInstruction(insn1,operands1,operand_count,insn1_bytes);
  ZydisValidateEnumRanges(insn1,operands1,operand_count);
  if (operand_count < insn1->operand_count_visible) {
LAB_0010f6e5:
    __assert_fail("operand_count >= insn1->operand_count_visible",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/tools/ZydisFuzzShared.c"
                  ,0x1dd,
                  "void ZydisReEncodeInstruction(const ZydisDecoder *, const ZydisDecodedInstruction *, const ZydisDecodedOperand *, ZyanU8, const ZyanU8 *)"
                 );
  }
  ZVar2 = ZydisEncoderDecodedInstructionToEncoderRequest
                    (insn1,operands1,insn1->operand_count_visible,&local_4e8);
  if ((int)ZVar2 < 0) {
    ZydisReEncodeInstruction_cold_1();
LAB_0010f709:
    ZydisReEncodeInstruction_cold_2();
LAB_0010f70e:
    ZydisReEncodeInstruction_cold_3();
LAB_0010f713:
    ZydisReEncodeInstruction_cold_7();
LAB_0010f718:
    ZydisReEncodeInstruction_cold_6();
  }
  else {
    local_650 = 0xf;
    ZVar2 = ZydisEncoderEncodeInstruction(&local_4e8,local_65f,&local_650);
    if ((int)ZVar2 < 0) goto LAB_0010f709;
    ZVar2 = ZydisDecoderDecodeFull(decoder,local_65f,local_650,&local_630,local_358);
    if ((int)ZVar2 < 0) goto LAB_0010f70e;
    operands = local_358;
    ZydisPrintInstruction(&local_630,operands,local_630.operand_count_visible,local_65f);
    ZydisValidateEnumRanges(&local_630,operands,local_630.operand_count_visible);
    ZydisValidateInstructionIdentity(insn1,operands1,&local_630,operands);
    uVar4 = (ulong)local_630.length;
    if (insn1->length < local_630.length) goto LAB_0010f713;
    lVar5 = 0x8000;
    if (local_630.address_width != '\x10') {
      if (local_630.address_width == '@') {
        lVar5 = -0x8000000000000000;
      }
      else {
        if (local_630.address_width != ' ') goto LAB_0010f722;
        lVar5 = 0x80000000;
      }
    }
    lVar8 = 0x8000;
    if (local_630.operand_width != '\x10') {
      lVar8 = lVar5;
    }
    if (local_630.machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
      lVar8 = lVar5;
    }
    if (local_4e8.operand_count == 0) {
      return;
    }
    pZVar6 = &local_4e8.operands[0].mem.displacement;
    uVar7 = 0;
    bVar1 = false;
    do {
      if ((int)pZVar6[-4] == 2) {
        result_address = pZVar6;
        if (((operands->field_10).mem.base & ~ZYDIS_REGISTER_AL) != ZYDIS_REGISTER_EIP)
        goto LAB_0010f653;
      }
      else if (((int)pZVar6[-4] == 4) && ((operands->field_10).imm.is_relative != '\0')) {
        result_address = pZVar6 + 3;
      }
      else {
LAB_0010f653:
        result_address = (ZyanI64 *)0x0;
      }
      if (result_address != (ZyanI64 *)0x0) {
        ZVar2 = ZydisCalcAbsoluteAddress
                          (&local_630,operands,lVar8 - uVar4,(ZyanU64 *)result_address);
        bVar1 = true;
        if ((int)ZVar2 < 0) {
          ZydisReEncodeInstruction_cold_4();
          goto LAB_0010f6e5;
        }
      }
      uVar7 = uVar7 + 1;
      pZVar6 = pZVar6 + 8;
      operands = operands + 1;
    } while (uVar7 < local_4e8.operand_count);
    if (!bVar1) {
      return;
    }
    local_648 = 0xf;
    ZVar2 = ZydisEncoderEncodeInstructionAbsolute(&local_4e8,local_63f,&local_648,lVar8 - uVar4);
    if (-1 < (int)ZVar2) {
      if ((local_648 == local_630.length) &&
         (iVar3 = bcmp(local_63f,local_65f,(ulong)local_630.length), iVar3 == 0)) {
        return;
      }
      goto LAB_0010f718;
    }
  }
  ZydisReEncodeInstruction_cold_5();
LAB_0010f722:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/tools/ZydisFuzzShared.c"
                ,0x196,
                "void ZydisReEncodeInstructionAbsolute(ZydisEncoderRequest *, const ZydisDecodedInstruction *, const ZydisDecodedOperand *, const ZyanU8 *)"
               );
}

Assistant:

void ZydisReEncodeInstruction(const ZydisDecoder *decoder, const ZydisDecodedInstruction *insn1,
    const ZydisDecodedOperand* operands1, ZyanU8 operand_count, const ZyanU8 *insn1_bytes)
{
    ZydisPrintInstruction(insn1, operands1, operand_count, insn1_bytes);
    ZydisValidateEnumRanges(insn1, operands1, operand_count);

    ZYAN_ASSERT(operand_count >= insn1->operand_count_visible);

    ZydisEncoderRequest request;
    ZyanStatus status = ZydisEncoderDecodedInstructionToEncoderRequest(insn1, operands1,
        insn1->operand_count_visible, &request);
    if (!ZYAN_SUCCESS(status))
    {
        fputs("ZydisEncoderDecodedInstructionToEncoderRequest failed\n", ZYAN_STDERR);
        abort();
    }

    ZyanU8 encoded_instruction[ZYDIS_MAX_INSTRUCTION_LENGTH];
    ZyanUSize encoded_length = sizeof(encoded_instruction);
    status = ZydisEncoderEncodeInstruction(&request, encoded_instruction, &encoded_length);
    if (!ZYAN_SUCCESS(status))
    {
        fputs("Failed to re-encode instruction\n", ZYAN_STDERR);
        abort();
    }

    ZydisDecodedInstruction insn2;
    ZydisDecodedOperand operands2[ZYDIS_MAX_OPERAND_COUNT];
    status = ZydisDecoderDecodeFull(decoder, encoded_instruction, encoded_length, &insn2,
        operands2);
    if (!ZYAN_SUCCESS(status))
    {
        fputs("Failed to decode re-encoded instruction\n", ZYAN_STDERR);
        abort();
    }

    ZydisPrintInstruction(&insn2, operands2, insn2.operand_count_visible, encoded_instruction);
    ZydisValidateEnumRanges(&insn2, operands2, insn2.operand_count_visible);
    ZydisValidateInstructionIdentity(insn1, operands1, &insn2, operands2);

    if (insn2.length > insn1->length)
    {
        fputs("Suboptimal output size detected\n", ZYAN_STDERR);
        abort();
    }

    ZydisReEncodeInstructionAbsolute(&request, &insn2, operands2, encoded_instruction);
}